

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O2

nullres nullcAnalyze(char *code)

{
  int iVar1;
  CompilerContext *pCVar2;
  ExprModule *pEVar3;
  nullres nVar4;
  TraceScope traceScope;
  TraceScope local_20;
  
  if (NULLC::initialized == '\0') {
    NULLC::nullcLastError = "ERROR: NULLC is not initialized";
    nVar4 = '\0';
  }
  else {
    if (nullcAnalyze::token == '\0') {
      iVar1 = __cxa_guard_acquire(&nullcAnalyze::token);
      if (iVar1 != 0) {
        nullcAnalyze::token = NULLC::TraceGetToken("nullc","nullcAnalyze");
        __cxa_guard_release(&nullcAnalyze::token);
      }
    }
    NULLC::TraceScope::TraceScope(&local_20,nullcAnalyze::token);
    NULLC::nullcLastError = "";
    NULLC::destruct<CompilerContext>(NULLC::compilerCtx);
    GrowingAllocatorRef<ChunkedStackPool<65532>,_16384U>::Clear
              ((GrowingAllocatorRef<ChunkedStackPool<65532>,_16384U> *)NULLC::allocator);
    pCVar2 = (CompilerContext *)(*(code *)NULLC::alloc)(0xa850);
    CompilerContext::CompilerContext
              (pCVar2,(Allocator *)NULLC::allocator,NULLC::optimizationLevel,
               (ArrayView<InplaceStr>)ZEXT816(0));
    NULLC::compilerCtx = pCVar2;
    *NULLC::errorBuf = '\0';
    pCVar2 = NULLC::compilerCtx;
    NULLC::compilerCtx->errorBuf = NULLC::errorBuf;
    pCVar2->errorBufSize = 0x10000;
    pCVar2->enableLogFiles = (bool)NULLC::enableLogFiles;
    (pCVar2->outputCtx).openStream = (_func_void_ptr_char_ptr *)NULLC::openStream;
    (pCVar2->outputCtx).writeStream = (_func_void_void_ptr_char_ptr_uint *)NULLC::writeStream;
    (pCVar2->outputCtx).closeStream = (_func_void_void_ptr *)NULLC::closeStream;
    (pCVar2->outputCtx).outputBuf = NULLC::outputBuf;
    (pCVar2->outputCtx).outputBufSize = 0x2000;
    (pCVar2->outputCtx).tempBuf = NULLC::tempOutputBuf;
    (pCVar2->outputCtx).tempBufSize = 0x4000;
    pCVar2->exprMemoryLimit = NULLC::moduleAnalyzeMemoryLimit;
    pCVar2->code = code;
    pEVar3 = AnalyzeModuleFromSource(pCVar2);
    nVar4 = '\x01';
    if (pEVar3 == (ExprModule *)0x0) {
      if (NULLC::compilerCtx->errorPos == (char *)0x0) {
        NULLC::nullcLastError = "ERROR: internal error";
      }
      else {
        NULLC::nullcLastError = NULLC::compilerCtx->errorBuf;
      }
      nVar4 = '\0';
    }
    NULLC::TraceScope::~TraceScope(&local_20);
  }
  return nVar4;
}

Assistant:

nullres nullcAnalyze(const char* code)
{
	using namespace NULLC;
	NULLC_CHECK_INITIALIZED(false);

	TRACE_SCOPE("nullc", "nullcAnalyze");

	nullcLastError = "";

	NULLC::destruct(compilerCtx);

	allocator.Clear();

	compilerCtx = new(NULLC::alloc(sizeof(CompilerContext))) CompilerContext(&allocator, optimizationLevel, ArrayView<InplaceStr>());

	*errorBuf = 0;

	compilerCtx->errorBuf = errorBuf;
	compilerCtx->errorBufSize = NULLC_ERROR_BUFFER_SIZE;

	compilerCtx->enableLogFiles = enableLogFiles;

	compilerCtx->outputCtx.openStream = openStream;
	compilerCtx->outputCtx.writeStream = writeStream;
	compilerCtx->outputCtx.closeStream = closeStream;

	compilerCtx->outputCtx.outputBuf = outputBuf;
	compilerCtx->outputCtx.outputBufSize = NULLC_OUTPUT_BUFFER_SIZE;

	compilerCtx->outputCtx.tempBuf = tempOutputBuf;
	compilerCtx->outputCtx.tempBufSize = NULLC_TEMP_OUTPUT_BUFFER_SIZE;

	compilerCtx->exprMemoryLimit = moduleAnalyzeMemoryLimit;

	compilerCtx->code = code;

	if(!AnalyzeModuleFromSource(*compilerCtx))
	{
		if(compilerCtx->errorPos)
			nullcLastError = compilerCtx->errorBuf;
		else
			nullcLastError = "ERROR: internal error";

		return 0;
	}

	return 1;
}